

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

MainFunc __thiscall capnp::compiler::CompilerMain::getDecodeMain(CompilerMain *this)

{
  ProcessContext *context;
  StringPtr extendedDescription;
  StringPtr helpText;
  initializer_list<kj::MainBuilder::OptionName> names;
  StringPtr helpText_00;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  StringPtr helpText_01;
  initializer_list<kj::MainBuilder::OptionName> names_01;
  StringPtr helpText_02;
  initializer_list<kj::MainBuilder::OptionName> names_02;
  StringPtr briefDescription;
  StringPtr version;
  MainBuilder *pMVar1;
  Type *func;
  Type *func_00;
  Type *func_01;
  Type *func_02;
  Type *func_03;
  Type *func_04;
  Iface *extraout_RDX;
  CompilerMain *in_RSI;
  MainFunc MVar2;
  undefined1 local_26a [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:197:30),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:197:30)>
  local_268;
  Function<kj::MainBuilder::Validity_()> local_258;
  undefined1 local_242 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:196:33),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:196:33)>
  local_240;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_230;
  StringPtr local_220;
  undefined1 local_20a [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:195:40),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:195:40)>
  local_208;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_1f8;
  StringPtr local_1e8;
  StringPtr local_1d8;
  undefined1 local_1c2 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:191:34),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:191:34)>
  local_1c0;
  Function<kj::MainBuilder::Validity_()> local_1b0;
  OptionName local_1a0 [2];
  StringPtr local_180;
  undefined1 local_16a [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:188:34),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:188:34)>
  local_168;
  Function<kj::MainBuilder::Validity_()> local_158;
  OptionName local_148 [2];
  StringPtr local_128;
  undefined1 local_112 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:182:40),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:182:40)>
  local_110;
  Function<kj::MainBuilder::Validity_()> local_100;
  OptionName local_f0;
  OptionName local_e0 [2];
  StringPtr local_c0;
  undefined1 local_aa [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:179:33),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:179:33)>
  local_a8;
  Function<kj::MainBuilder::Validity_()> local_98;
  OptionName local_88 [3];
  StringPtr local_58;
  StringPtr local_48;
  StringPtr local_38;
  undefined1 local_28 [8];
  MainBuilder builder;
  CompilerMain *this_local;
  
  in_RSI->compileEagerness = 1;
  in_RSI->annotationFlag = DROP_ANNOTATIONS;
  context = in_RSI->context;
  kj::StringPtr::StringPtr(&local_38,"Cap\'n Proto version (unknown)");
  kj::StringPtr::StringPtr
            (&local_48,
             "Decodes one or more encoded Cap\'n Proto messages as text.  The messages have root type <type> defined in <schema-file>.  Messages are read from standard input and by default are expected to be in standard Cap\'n Proto serialization format."
            );
  kj::StringPtr::StringPtr(&local_58,(void *)0x0);
  version.content.size_ = local_38.content.size_;
  version.content.ptr = local_38.content.ptr;
  briefDescription.content.size_ = local_48.content.size_;
  briefDescription.content.ptr = local_48.content.ptr;
  extendedDescription.content.size_ = local_58.content.size_;
  extendedDescription.content.ptr = local_58.content.ptr;
  kj::MainBuilder::MainBuilder
            ((MainBuilder *)local_28,context,version,briefDescription,extendedDescription);
  addGlobalOptions(in_RSI,(MainBuilder *)local_28);
  kj::MainBuilder::OptionName::OptionName(local_88,"flat");
  local_88[1]._0_8_ = local_88;
  local_88[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x1;
  local_a8.t = (CompilerMain *)
               kj::_::
               boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_2_>
                         ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:179:33),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:179:33)>
                           *)in_RSI,(_ *)(local_aa + 1),(CompilerMain *)local_aa,
                          (Type *)local_38.content.size_,(Type *)local_48.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_98,&local_a8);
  kj::StringPtr::StringPtr
            (&local_c0,
             "Interpret the input as one large single-segment message rather than a stream in standard serialization format.  (Rarely used.)"
            );
  names_02._M_len = (size_type)local_88[1].field_1;
  names_02._M_array = (iterator)local_88[1]._0_8_;
  helpText_02.content.size_ = local_c0.content.size_;
  helpText_02.content.ptr = local_c0.content.ptr;
  func = (Type *)&local_98;
  pMVar1 = kj::MainBuilder::addOption
                     ((MainBuilder *)local_28,names_02,
                      (Function<kj::MainBuilder::Validity_()> *)func,helpText_02);
  kj::MainBuilder::OptionName::OptionName(&local_f0,'p');
  kj::MainBuilder::OptionName::OptionName(local_e0,"packed");
  local_e0[1]._0_8_ = &local_f0;
  local_e0[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x2;
  local_110.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_4_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:182:40),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:182:40)>
                            *)in_RSI,(_ *)(local_112 + 1),(CompilerMain *)local_112,func,
                           (Type *)local_c0.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_4_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_100,&local_110);
  kj::StringPtr::StringPtr
            (&local_128,
             "Expect the input to be packed using standard Cap\'n Proto packing, which deflates zero-valued bytes.  (This reads messages written with capnp::writePackedMessage*() from <capnp/serialize-packed.h>.  Do not use this for messages written with capnp::writeMessage*() from <capnp/serialize.h>.)"
            );
  names_01._M_len = (size_type)local_e0[1].field_1;
  names_01._M_array = (iterator)local_e0[1]._0_8_;
  helpText_01.content.size_ = local_128.content.size_;
  helpText_01.content.ptr = local_128.content.ptr;
  func_00 = (Type *)&local_100;
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names_01,(Function<kj::MainBuilder::Validity_()> *)func_00,helpText_01)
  ;
  kj::MainBuilder::OptionName::OptionName(local_148,"short");
  local_148[1]._0_8_ = local_148;
  local_148[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x1;
  local_168.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_6_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:188:34),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:188:34)>
                            *)in_RSI,(_ *)(local_16a + 1),(CompilerMain *)local_16a,func_00,
                           (Type *)local_128.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_6_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_158,&local_168);
  kj::StringPtr::StringPtr
            (&local_180,
             "Print in short (non-pretty) format.  Each message will be printed on one line, without using whitespace to improve readability."
            );
  names_00._M_len = (size_type)local_148[1].field_1;
  names_00._M_array = (iterator)local_148[1]._0_8_;
  helpText_00.content.size_ = local_180.content.size_;
  helpText_00.content.ptr = local_180.content.ptr;
  func_01 = (Type *)&local_158;
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names_00,(Function<kj::MainBuilder::Validity_()> *)func_01,helpText_00)
  ;
  kj::MainBuilder::OptionName::OptionName(local_1a0,"quiet");
  local_1a0[1]._0_8_ = local_1a0;
  local_1a0[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x1;
  local_1c0.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_8_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:191:34),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:191:34)>
                            *)in_RSI,(_ *)(local_1c2 + 1),(CompilerMain *)local_1c2,func_01,
                           (Type *)local_180.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_8_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_1b0,&local_1c0);
  kj::StringPtr::StringPtr
            (&local_1d8,
             "Do not print warning messages about the input being in the wrong format.  Use this if you find the warnings are wrong (but also let us know so we can improve them)."
            );
  names._M_len = (size_type)local_1a0[1].field_1;
  names._M_array = (iterator)local_1a0[1]._0_8_;
  helpText.content.size_ = local_1d8.content.size_;
  helpText.content.ptr = local_1d8.content.ptr;
  func_02 = (Type *)&local_1b0;
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names,(Function<kj::MainBuilder::Validity_()> *)func_02,helpText);
  kj::StringPtr::StringPtr(&local_1e8,"<schema-file>");
  local_208.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_9_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_10_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:195:40),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:195:40)>
                            *)in_RSI,(_ *)(local_20a + 1),(CompilerMain *)local_20a,func_02,
                           (Type *)local_1d8.content.ptr);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_9_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_10_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_1f8,&local_208);
  func_03 = (Type *)&local_1f8;
  pMVar1 = kj::MainBuilder::expectArg
                     (pMVar1,local_1e8,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func_03);
  kj::StringPtr::StringPtr(&local_220,"<type>");
  local_240.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_11_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_12_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:196:33),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:196:33)>
                            *)in_RSI,(_ *)(local_242 + 1),(CompilerMain *)local_242,func_03,
                           (Type *)local_1d8.content.ptr);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_11_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_12_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_230,&local_240);
  func_04 = (Type *)&local_230;
  pMVar1 = kj::MainBuilder::expectArg
                     (pMVar1,local_220,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func_04);
  local_268.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_13_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_14_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:197:30),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:197:30)>
                            *)in_RSI,(_ *)(local_26a + 1),(CompilerMain *)local_26a,func_04,
                           (Type *)local_1d8.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_13_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_14_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_258,&local_268);
  kj::MainBuilder::callAfterParsing(pMVar1,&local_258);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_258);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(&local_230);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(&local_1f8);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_1b0);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_158);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_100);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_98);
  kj::MainBuilder::build((MainBuilder *)this);
  kj::MainBuilder::~MainBuilder((MainBuilder *)local_28);
  MVar2.impl.ptr = extraout_RDX;
  MVar2.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar2.impl;
}

Assistant:

kj::MainFunc getDecodeMain() {
    // Only parse the schemas we actually need for decoding.
    compileEagerness = Compiler::NODE;

    // Drop annotations since we don't need them.  This avoids importing files like c++.capnp.
    annotationFlag = Compiler::DROP_ANNOTATIONS;

    kj::MainBuilder builder(context, VERSION_STRING,
          "Decodes one or more encoded Cap'n Proto messages as text.  The messages have root "
          "type <type> defined in <schema-file>.  Messages are read from standard input and "
          "by default are expected to be in standard Cap'n Proto serialization format.");
    addGlobalOptions(builder);
    builder.addOption({"flat"}, KJ_BIND_METHOD(*this, codeFlat),
                      "Interpret the input as one large single-segment message rather than a "
                      "stream in standard serialization format.  (Rarely used.)")
           .addOption({'p', "packed"}, KJ_BIND_METHOD(*this, codePacked),
                      "Expect the input to be packed using standard Cap'n Proto packing, which "
                      "deflates zero-valued bytes.  (This reads messages written with "
                      "capnp::writePackedMessage*() from <capnp/serialize-packed.h>.  Do not use "
                      "this for messages written with capnp::writeMessage*() from "
                      "<capnp/serialize.h>.)")
           .addOption({"short"}, KJ_BIND_METHOD(*this, printShort),
                      "Print in short (non-pretty) format.  Each message will be printed on one "
                      "line, without using whitespace to improve readability.")
           .addOption({"quiet"}, KJ_BIND_METHOD(*this, setQuiet),
                      "Do not print warning messages about the input being in the wrong format.  "
                      "Use this if you find the warnings are wrong (but also let us know so "
                      "we can improve them).")
           .expectArg("<schema-file>", KJ_BIND_METHOD(*this, addSource))
           .expectArg("<type>", KJ_BIND_METHOD(*this, setRootType))
           .callAfterParsing(KJ_BIND_METHOD(*this, decode));
    return builder.build();
  }